

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O0

qpCrashHandler * qpCrashHandler_create(qpCrashHandlerFunc handlerFunc,void *userPointer)

{
  qpCrashHandlerFunc local_d0;
  int local_c4;
  undefined1 auStack_c0 [4];
  int sigNdx;
  sigaction action;
  qpCrashHandler *handler;
  void *userPointer_local;
  qpCrashHandlerFunc handlerFunc_local;
  
  action.sa_restorer = (_func_void *)deCalloc(0x3c8);
  handlerFunc_local = (qpCrashHandlerFunc)action.sa_restorer;
  if ((qpCrashHandlerFunc)action.sa_restorer != (qpCrashHandlerFunc)0x0) {
    local_d0 = handlerFunc;
    if (handlerFunc == (qpCrashHandlerFunc)0x0) {
      local_d0 = defaultCrashHandler;
    }
    *(qpCrashHandlerFunc *)action.sa_restorer = local_d0;
    *(void **)((qpCrashHandlerFunc)action.sa_restorer + 8) = userPointer;
    qpCrashInfo_init((qpCrashInfo *)((qpCrashHandlerFunc)action.sa_restorer + 0x10));
    g_crashHandler = (qpCrashHandler *)action.sa_restorer;
    deSetAssertFailureCallback(assertFailureCallback);
    sigemptyset((sigset_t *)&action);
    _auStack_c0 = signalHandler;
    action.sa_mask.__val[0xf]._0_4_ = 0;
    for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
      sigaction(s_signals[local_c4].signalNum,(sigaction *)auStack_c0,
                (sigaction *)(action.sa_restorer + (long)local_c4 * 0x98 + 0x38));
    }
    handlerFunc_local = (qpCrashHandlerFunc)action.sa_restorer;
  }
  return (qpCrashHandler *)handlerFunc_local;
}

Assistant:

qpCrashHandler* qpCrashHandler_create (qpCrashHandlerFunc handlerFunc, void* userPointer)
{
	/* Allocate & initialize. */
	qpCrashHandler* handler = (qpCrashHandler*)deCalloc(sizeof(qpCrashHandler));
	DBGPRINT(("qpCrashHandler::create()\n"));
	if (!handler)
		return handler;

	DE_ASSERT(g_crashHandler == DE_NULL);

	handler->crashHandlerFunc	= handlerFunc ? handlerFunc : defaultCrashHandler;
	handler->handlerUserPointer	= userPointer;

	qpCrashInfo_init(&handler->crashInfo);

	g_crashHandler = handler;

	/* DE_ASSERT callback. */
	deSetAssertFailureCallback(assertFailureCallback);

#if defined(QP_USE_SIGNAL_HANDLER)
	/* Register signal handlers. */
	{
		struct sigaction	action;
		int					sigNdx;

		sigemptyset(&action.sa_mask);
		action.sa_handler	= signalHandler;
		action.sa_flags		= 0;

		for (sigNdx = 0; sigNdx < DE_LENGTH_OF_ARRAY(s_signals); sigNdx++)
			sigaction(s_signals[sigNdx].signalNum, &action, &handler->oldHandlers[sigNdx]);
	}
#endif

	return handler;
}